

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mode5TransponderBasicData.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::Mode5TransponderBasicData::Decode
          (Mode5TransponderBasicData *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *pKVar2;
  allocator<char> local_39;
  KString local_38;
  KDataStream *local_18;
  KDataStream *stream_local;
  Mode5TransponderBasicData *this_local;
  
  local_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  if (KVar1 < 0x10) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
    KException::KException(this_00,&local_38,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  pKVar2 = operator>>(local_18,&(this->m_Status).super_DataTypeBase);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui16PIN);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui32MsgFormats);
  pKVar2 = operator>>(pKVar2,(DataTypeBase *)&this->m_EM1Code);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui16NationalOrigin);
  pKVar2 = operator>>(pKVar2,&(this->m_SupplementalData).super_DataTypeBase);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui8NavSrc);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui8FigMerit);
  KDataStream::operator>>(pKVar2,&this->m_ui8Padding);
  return;
}

Assistant:

void Mode5TransponderBasicData::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < MODE_5_TRANSPONDER_BASIC_DATA_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> KDIS_STREAM m_Status
           >> m_ui16PIN
           >> m_ui32MsgFormats
           >> KDIS_STREAM m_EM1Code
           >> m_ui16NationalOrigin
           >> KDIS_STREAM m_SupplementalData
           >> m_ui8NavSrc
           >> m_ui8FigMerit
           >> m_ui8Padding;
}